

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginDragDropTarget(void)

{
  ImGuiWindow *this;
  ImGuiContext *pIVar1;
  ImRect *local_40;
  ImGuiID local_34;
  ImGuiID id;
  ImRect *display_rect;
  ImGuiWindow *hovered_window;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  if ((GImGui->DragDropActive & 1U) == 0) {
    g._7_1_ = false;
  }
  else {
    this = GImGui->CurrentWindow;
    if (((this->DC).LastItemStatusFlags & 1U) == 0) {
      g._7_1_ = false;
    }
    else if ((GImGui->HoveredWindowUnderMovingWindow == (ImGuiWindow *)0x0) ||
            (this->RootWindow != GImGui->HoveredWindowUnderMovingWindow->RootWindow)) {
      g._7_1_ = false;
    }
    else {
      if (((this->DC).LastItemStatusFlags & 2U) == 0) {
        local_40 = &(this->DC).LastItemRect;
      }
      else {
        local_40 = &(this->DC).LastItemDisplayRect;
      }
      local_34 = (this->DC).LastItemId;
      if (local_34 == 0) {
        local_34 = ImGuiWindow::GetIDFromRectangle(this,local_40);
      }
      if ((pIVar1->DragDropPayload).SourceId == local_34) {
        g._7_1_ = false;
      }
      else {
        if ((pIVar1->DragDropWithinTarget & 1U) != 0) {
          __assert_fail("g.DragDropWithinTarget == false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                        ,0x2712,"bool ImGui::BeginDragDropTarget()");
        }
        (pIVar1->DragDropTargetRect).Min = local_40->Min;
        (pIVar1->DragDropTargetRect).Max = local_40->Max;
        pIVar1->DragDropTargetId = local_34;
        pIVar1->DragDropWithinTarget = true;
        g._7_1_ = true;
      }
    }
  }
  return g._7_1_;
}

Assistant:

bool ImGui::BeginDragDropTarget()
{
    ImGuiContext& g = *GImGui;
    if (!g.DragDropActive)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (!(window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HoveredRect))
        return false;
    ImGuiWindow* hovered_window = g.HoveredWindowUnderMovingWindow;
    if (hovered_window == NULL || window->RootWindow != hovered_window->RootWindow)
        return false;

    const ImRect& display_rect = (window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HasDisplayRect) ? window->DC.LastItemDisplayRect : window->DC.LastItemRect;
    ImGuiID id = window->DC.LastItemId;
    if (id == 0)
        id = window->GetIDFromRectangle(display_rect);
    if (g.DragDropPayload.SourceId == id)
        return false;

    IM_ASSERT(g.DragDropWithinTarget == false);
    g.DragDropTargetRect = display_rect;
    g.DragDropTargetId = id;
    g.DragDropWithinTarget = true;
    return true;
}